

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenInitializer::InitCustomTargets(cmQtAutoGenInitializer *this)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *pcVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b;
  bool bVar3;
  int iVar4;
  PolicyStatus PVar5;
  uint uVar6;
  string *psVar7;
  ulong uVar8;
  cmState *pcVar9;
  size_type sVar10;
  size_type sVar11;
  const_reference __args;
  const_reference __args_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  string_view sVar13;
  pair<std::_Rb_tree_const_iterator<cmTarget_*>,_bool> pVar14;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_868;
  allocator<char> local_6d1;
  string local_6d0;
  allocator<char> local_6a9;
  string local_6a8;
  allocator<char> local_681;
  string local_680;
  cmValue local_660;
  cmValue *local_658;
  cmValue *value;
  size_type sStack_648;
  bool addBefore;
  size_type ii;
  string local_638;
  undefined1 local_612;
  allocator<char> local_611;
  string local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  iterator local_5c8;
  size_type local_5c0;
  undefined1 local_5b8 [8];
  cmList filterList;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_598;
  const_iterator local_590;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_588;
  const_iterator local_580;
  allocator<char> local_571;
  string local_570;
  string_view local_550;
  allocator<char> local_539;
  string local_538;
  string_view local_518;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  cmValue local_498;
  _Base_ptr local_490;
  undefined1 local_488;
  _Base_ptr local_480;
  undefined1 local_478;
  cmTarget *local_470;
  cmTarget *depTarget;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *depName;
  iterator __end3;
  iterator __begin3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  iterator local_428;
  size_type local_420;
  cmList local_418;
  cmList *local_400;
  cmList *__range3;
  string local_3f0;
  string *local_3d0;
  string *deps;
  string local_3c0;
  string_view local_3a0;
  string local_390;
  string_view local_370;
  string_view local_360;
  string local_350;
  string_view local_330;
  string local_320;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b8;
  string *prop;
  unsigned_long propInt;
  int local_284;
  basic_string_view<char,_std::char_traits<char>_> local_280;
  string local_270;
  string_view local_250;
  string local_240;
  char local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  undefined1 local_190 [8];
  string cbd;
  string relativeBuildDir;
  string local_148;
  string *local_128;
  allocator<char> local_119;
  string local_118;
  string *local_f8;
  allocator<char> local_e9;
  string local_e8;
  cmValue local_c8;
  cmValue folder;
  unsigned_long local_b0;
  unsigned_long iVerb;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  string def;
  string local_38;
  cmQtAutoGenInitializer *local_18;
  cmQtAutoGenInitializer *this_local;
  
  local_18 = this;
  iVar4 = (*this->GlobalGen->_vptr_cmGlobalGenerator[0x28])();
  this->MultiConfig = SUB41(iVar4,0);
  cmMakefile::GetDefaultConfiguration_abi_cxx11_(&local_38,this->Makefile);
  std::__cxx11::string::operator=((string *)&this->ConfigDefault,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pvVar12 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(&def.field_2._M_allocated_capacity + 1);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(pvVar12,this->Makefile,IncludeEmptyConfig);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ConfigsList,pvVar12);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(pvVar12);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"CMAKE_AUTOGEN_VERBOSE",&local_91);
  psVar7 = cmMakefile::GetSafeDefinition(pcVar1,&local_90);
  std::__cxx11::string::string((string *)local_70,(string *)psVar7);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    local_b0 = 0;
    bVar3 = cmStrToULong((string *)local_70,&local_b0);
    if (bVar3) {
      this->Verbosity = (uint)local_b0;
    }
    else {
      sVar13 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_70);
      folder.Value = (string *)sVar13._M_len;
      bVar3 = cmIsOn(sVar13);
      if (bVar3) {
        this->Verbosity = 1;
      }
    }
  }
  std::__cxx11::string::~string((string *)local_70);
  pcVar9 = cmMakefile::GetState(this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"AUTOMOC_TARGETS_FOLDER",&local_e9);
  local_c8 = cmState::GetGlobalProperty(pcVar9,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  bVar3 = cmValue::operator_cast_to_bool(&local_c8);
  if (!bVar3) {
    pcVar9 = cmMakefile::GetState(this->Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"AUTOGEN_TARGETS_FOLDER",&local_119);
    local_f8 = (string *)cmState::GetGlobalProperty(pcVar9,&local_118);
    local_c8 = (cmValue)local_f8;
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
  }
  bVar3 = cmValue::operator_cast_to_bool(&local_c8);
  if (!bVar3) {
    pcVar2 = this->GenTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"FOLDER",
               (allocator<char> *)(relativeBuildDir.field_2._M_local_buf + 0xf));
    local_128 = (string *)cmGeneratorTarget::GetProperty(pcVar2,&local_148);
    local_c8 = (cmValue)local_128;
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator
              ((allocator<char> *)(relativeBuildDir.field_2._M_local_buf + 0xf));
  }
  bVar3 = cmValue::operator_cast_to_bool(&local_c8);
  if (bVar3) {
    psVar7 = cmValue::operator*[abi_cxx11_(&local_c8);
    std::__cxx11::string::operator=((string *)&this->TargetsFolder,(string *)psVar7);
  }
  PVar5 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0071,false);
  if (PVar5 != OLD) {
    if (PVar5 == WARN) {
      this->CMP0071Warn = true;
    }
    else if (PVar5 - NEW < 3) {
      this->CMP0071Accept = true;
    }
  }
  PVar5 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0100,false);
  if (PVar5 != OLD) {
    if (PVar5 == WARN) {
      this->CMP0100Warn = true;
    }
    else if (PVar5 - NEW < 3) {
      this->CMP0100Accept = true;
    }
  }
  std::__cxx11::string::string((string *)(cbd.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_1b0);
  psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this->Makefile);
  cmsys::SystemTools::CollapseFullPath((string *)local_190,&local_1b0,psVar7);
  std::__cxx11::string::~string((string *)&local_1b0);
  psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[13],std::__cxx11::string_const&,char_const(&)[13]>
            (&local_1d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
             (char (*) [13])0x107dc47,psVar7,(char (*) [13])"_autogen.dir");
  std::__cxx11::string::operator=((string *)&this->Dir,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  cmsys::SystemTools::ConvertToUnixSlashes(&(this->Dir).Info);
  pcVar2 = this->GenTarget;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"AUTOGEN_BUILD_DIR",&local_1f1);
  psVar7 = cmGeneratorTarget::GetSafeProperty(pcVar2,&local_1f0);
  std::__cxx11::string::operator=((string *)&(this->Dir).Build,(string *)psVar7);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) != 0) {
    local_219 = '/';
    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,char_const(&)[9]>
              (&local_218,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
               &local_219,psVar7,(char (*) [9])0x1047d66);
    std::__cxx11::string::operator=((string *)&(this->Dir).Build,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
  }
  cmsys::SystemTools::ConvertToUnixSlashes(&(this->Dir).Build);
  cmSystemTools::RelativePath(&local_240,(string *)local_190,&(this->Dir).Build);
  std::__cxx11::string::operator=((string *)&(this->Dir).RelativeBuild,(string *)&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  AddCleanFile(this,&(this->Dir).Build);
  std::__cxx11::string::operator=((string *)&(this->Dir).Work,(string *)local_190);
  cmsys::SystemTools::ConvertToUnixSlashes(&(this->Dir).Work);
  cmStrCat<std::__cxx11::string&,char_const(&)[9]>
            (&local_270,&(this->Dir).Build,(char (*) [9])0x103ee70);
  local_250 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_270);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_280,"");
  sVar13._M_str = local_280._M_str;
  sVar13._M_len = local_280._M_len;
  ConfigFileNamesAndGenex(this,&(this->Dir).Include,&(this->Dir).IncludeGenExp,local_250,sVar13);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)local_190);
  bVar3 = MocOrUicEnabled(this);
  if (bVar3) {
    if (((this->Moc).super_GenVarsT.Enabled & 1U) != 0) {
      bVar3 = InitMoc(this);
      if (!bVar3) {
        this_local._7_1_ = 0;
        local_284 = 1;
        goto LAB_0040c64f;
      }
    }
    if (((this->Uic).super_GenVarsT.Enabled & 1U) != 0) {
      bVar3 = InitUic(this);
      if (!bVar3) {
        this_local._7_1_ = 0;
        local_284 = 1;
        goto LAB_0040c64f;
      }
    }
    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[9]>
              ((string *)&propInt,psVar7,(char (*) [9])0x1047d66);
    std::__cxx11::string::operator=((string *)&this->AutogenTarget,(string *)&propInt);
    std::__cxx11::string::~string((string *)&propInt);
    prop = (string *)0x0;
    pcVar2 = this->GenTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"AUTOGEN_PARALLEL",&local_2d9);
    psVar7 = cmGeneratorTarget::GetSafeProperty(pcVar2,&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator(&local_2d9);
    local_2b8 = psVar7;
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      bVar3 = std::operator==(local_2b8,"AUTO");
      if (bVar3) goto LAB_0040b0a5;
      bVar3 = cmStrToULong(local_2b8,(unsigned_long *)&prop);
      psVar7 = prop;
      if ((bVar3) && (prop != (string *)0x0)) {
        uVar6 = std::numeric_limits<unsigned_int>::max();
        if ((string *)(ulong)uVar6 < psVar7) goto LAB_0040b17a;
        (this->AutogenTarget).Parallel = (uint)prop;
      }
      else {
LAB_0040b17a:
        b = local_2b8;
        pcVar1 = this->Makefile;
        psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
        cmStrCat<char_const(&)[19],std::__cxx11::string_const&,char_const(&)[15],std::__cxx11::string_const&,char_const(&)[41]>
                  (&local_300,(char (*) [19])"AUTOGEN_PARALLEL=\"",b,
                   (char (*) [15])"\" for target \"",psVar7,
                   (char (*) [41])"\" is not valid. Using AUTOGEN_PARALLEL=1");
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_300);
        std::__cxx11::string::~string((string *)&local_300);
        (this->AutogenTarget).Parallel = 1;
      }
    }
    else {
LAB_0040b0a5:
      uVar6 = anon_unknown.dwarf_5405ae::GetParallelCPUCount();
      (this->AutogenTarget).Parallel = uVar6;
    }
    cmStrCat<std::__cxx11::string&,char_const(&)[18]>
              (&local_320,&(this->Dir).Info,(char (*) [18])"/AutogenInfo.json");
    std::__cxx11::string::operator=((string *)&(this->AutogenTarget).InfoFile,(string *)&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    cmStrCat<std::__cxx11::string&,char_const(&)[13]>
              (&local_350,&(this->Dir).Info,(char (*) [13])"/AutogenUsed");
    local_330 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_350);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_360,".txt");
    ConfigFileNames(this,&(this->AutogenTarget).SettingsFile,local_330,local_360);
    std::__cxx11::string::~string((string *)&local_350);
    ConfigFileClean(this,&(this->AutogenTarget).SettingsFile);
    cmStrCat<std::__cxx11::string&,char_const(&)[12]>
              (&local_390,&(this->Dir).Info,(char (*) [12])"/ParseCache");
    local_370 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_390);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3a0,".txt");
    ConfigFileNames(this,&(this->AutogenTarget).ParseCacheFile,local_370,local_3a0);
    std::__cxx11::string::~string((string *)&local_390);
    ConfigFileClean(this,&(this->AutogenTarget).ParseCacheFile);
    pcVar2 = this->GenTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"AUTOGEN_ORIGIN_DEPENDS",(allocator<char> *)((long)&deps + 7));
    bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_3c0);
    (this->AutogenTarget).DependOrigin = bVar3;
    std::__cxx11::string::~string((string *)&local_3c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&deps + 7));
    pcVar2 = this->GenTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f0,"AUTOGEN_TARGET_DEPENDS",
               (allocator<char> *)((long)&__range3 + 7));
    psVar7 = cmGeneratorTarget::GetSafeProperty(pcVar2,&local_3f0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
    local_3d0 = psVar7;
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      std::__cxx11::string::string((string *)&local_448,(string *)local_3d0);
      local_428 = &local_448;
      local_420 = 1;
      init_00._M_len = 1;
      init_00._M_array = local_428;
      cmList::cmList(&local_418,init_00);
      local_868 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_428;
      do {
        local_868 = local_868 + -1;
        std::__cxx11::string::~string((string *)local_868);
      } while (local_868 != &local_448);
      local_400 = &local_418;
      __end3 = cmList::begin_abi_cxx11_(local_400);
      depName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                cmList::end_abi_cxx11_(local_400);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&depName);
        if (!bVar3) break;
        depTarget = (cmTarget *)
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3);
        local_470 = cmMakefile::FindTargetToUse(this->Makefile,(string *)depTarget,false);
        if (local_470 == (cmTarget *)0x0) {
          pVar15 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert(&(this->AutogenTarget).DependFiles,(value_type *)depTarget);
          local_490 = (_Base_ptr)pVar15.first._M_node;
          local_488 = pVar15.second;
        }
        else {
          pVar14 = std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::insert
                             (&(this->AutogenTarget).DependTargets,&local_470);
          local_480 = (_Base_ptr)pVar14.first._M_node;
          local_478 = pVar14.second;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      local_284 = 4;
      cmList::~cmList(&local_418);
    }
    if (((this->Moc).super_GenVarsT.Enabled & 1U) != 0) {
      pcVar2 = this->GenTarget;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b8,"AUTOMOC_PATH_PREFIX",&local_4b9);
      local_498 = cmGeneratorTarget::GetProperty(pcVar2,&local_4b8);
      bVar3 = cmValue::IsOn(&local_498);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::allocator<char>::~allocator(&local_4b9);
      if (bVar3) {
        (this->Moc).PathPrefix = true;
      }
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e0,"CMAKE_AUTOMOC_RELAXED_MODE",&local_4e1);
      bVar3 = cmMakefile::IsOn(pcVar1,&local_4e0);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::allocator<char>::~allocator(&local_4e1);
      if (bVar3) {
        (this->Moc).RelaxedMode = true;
        pcVar1 = this->Makefile;
        psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
        cmStrCat<char_const(&)[134],std::__cxx11::string_const&,char_const(&)[18]>
                  (&local_508,
                   (char (*) [134])
                   "AUTOMOC: CMAKE_AUTOMOC_RELAXED_MODE is deprecated an will be removed in the future.  Consider disabling it and converting the target "
                   ,psVar7,(char (*) [18])" to regular mode.");
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_508);
        std::__cxx11::string::~string((string *)&local_508);
      }
      pcVar2 = this->GenTarget;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_538,"AUTOMOC_MOC_OPTIONS",&local_539);
      psVar7 = cmGeneratorTarget::GetSafeProperty(pcVar2,&local_538);
      local_518 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
      cmExpandList(local_518,&(this->Moc).Options,No);
      std::__cxx11::string::~string((string *)&local_538);
      std::allocator<char>::~allocator(&local_539);
      pcVar2 = this->GenTarget;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_570,"AUTOMOC_MACRO_NAMES",&local_571);
      psVar7 = cmGeneratorTarget::GetSafeProperty(pcVar2,&local_570);
      local_550 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
      cmExpandList(local_550,&(this->Moc).MacroNames,No);
      std::__cxx11::string::~string((string *)&local_570);
      std::allocator<char>::~allocator(&local_571);
      pvVar12 = &(this->Moc).MacroNames;
      local_588._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           cmRemoveDuplicates<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (pvVar12);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_580,&local_588);
      local_598._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&(this->Moc).MacroNames);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_590,&local_598);
      filterList.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::erase(pvVar12,local_580,local_590);
      local_612 = 1;
      local_5f0 = &local_5e8;
      pcVar2 = this->GenTarget;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_610,"AUTOMOC_DEPEND_FILTERS",&local_611);
      psVar7 = cmGeneratorTarget::GetSafeProperty(pcVar2,&local_610);
      std::__cxx11::string::string((string *)&local_5e8,(string *)psVar7);
      local_612 = 0;
      local_5c8 = &local_5e8;
      local_5c0 = 1;
      init._M_len = 1;
      init._M_array = local_5c8;
      cmList::cmList((cmList *)local_5b8,init);
      local_978 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5c8;
      do {
        local_978 = local_978 + -1;
        std::__cxx11::string::~string((string *)local_978);
      } while (local_978 != &local_5e8);
      std::__cxx11::string::~string((string *)&local_610);
      std::allocator<char>::~allocator(&local_611);
      sVar10 = cmList::size((cmList *)local_5b8);
      if ((sVar10 & 1) == 0) {
        sVar10 = cmList::size((cmList *)local_5b8);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::reserve(&(this->Moc).DependFilters,(sVar10 >> 1) + 1);
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<char_const(&)[18],char_const(&)[57]>
                  ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)&(this->Moc).DependFilters,(char (*) [18])"Q_PLUGIN_METADATA",
                   (char (*) [57])
                   "[\n][ \t]*Q_PLUGIN_METADATA[ \t]*\\([^\\)]*FILE[ \t]*\"([^\"]+)\"");
        sStack_648 = 0;
        while( true ) {
          sVar10 = sStack_648;
          sVar11 = cmList::size((cmList *)local_5b8);
          if (sVar10 == sVar11) break;
          __args = cmList::operator[][abi_cxx11_((cmList *)local_5b8,sStack_648);
          __args_1 = cmList::operator[][abi_cxx11_((cmList *)local_5b8,sStack_648 + 1);
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)&(this->Moc).DependFilters,__args,__args_1);
          sStack_648 = sStack_648 + 2;
        }
        local_284 = 0;
      }
      else {
        ii = cmList::size((cmList *)local_5b8);
        cmStrCat<char_const(&)[46],unsigned_long,char_const(&)[25]>
                  (&local_638,(char (*) [46])"AutoMoc: AUTOMOC_DEPEND_FILTERS predefs size ",&ii,
                   (char (*) [25])" is not a multiple of 2.");
        cmSystemTools::Error(&local_638);
        std::__cxx11::string::~string((string *)&local_638);
        this_local._7_1_ = 0;
        local_284 = 1;
      }
      cmList::~cmList((cmList *)local_5b8);
      if (local_284 != 0) goto LAB_0040c64f;
    }
  }
  if (((this->Rcc).super_GenVarsT.Enabled & 1U) != 0) {
    bVar3 = InitRcc(this);
    if (!bVar3) {
      this_local._7_1_ = 0;
      local_284 = 1;
      goto LAB_0040c64f;
    }
  }
  bVar3 = MocOrUicEnabled(this);
  if ((bVar3) ||
     ((((this->Rcc).super_GenVarsT.Enabled & 1U) != 0 && ((this->MultiConfig & 1U) != 0)))) {
    value._7_1_ = 0;
    pcVar2 = this->GenTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_680,"AUTOGEN_USE_SYSTEM_INCLUDE",&local_681);
    local_660 = cmGeneratorTarget::GetProperty(pcVar2,&local_680);
    std::__cxx11::string::~string((string *)&local_680);
    std::allocator<char>::~allocator(&local_681);
    local_658 = &local_660;
    bVar3 = cmValue::IsSet(local_658);
    if (bVar3) {
      bVar3 = cmValue::IsOn(local_658);
      if (bVar3) {
        pcVar2 = this->GenTarget;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a8,"CXX",&local_6a9);
        cmGeneratorTarget::AddSystemIncludeDirectory(pcVar2,&(this->Dir).IncludeGenExp,&local_6a8);
        std::__cxx11::string::~string((string *)&local_6a8);
        std::allocator<char>::~allocator(&local_6a9);
      }
      else {
        value._7_1_ = 1;
      }
    }
    else {
      PVar5 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0151,false);
      if (PVar5 < NEW) {
        value._7_1_ = 1;
      }
      else if (PVar5 - NEW < 3) {
        pcVar2 = this->GenTarget;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d0,"CXX",&local_6d1);
        cmGeneratorTarget::AddSystemIncludeDirectory(pcVar2,&(this->Dir).IncludeGenExp,&local_6d0);
        std::__cxx11::string::~string((string *)&local_6d0);
        std::allocator<char>::~allocator(&local_6d1);
      }
    }
    cmGeneratorTarget::AddIncludeDirectory
              (this->GenTarget,&(this->Dir).IncludeGenExp,(bool)(value._7_1_ & 1));
  }
  bVar3 = InitScanFiles(this);
  if (bVar3) {
    bVar3 = MocOrUicEnabled(this);
    if (bVar3) {
      bVar3 = InitAutogenTarget(this);
      if (!bVar3) {
        this_local._7_1_ = 0;
        local_284 = 1;
        goto LAB_0040c64f;
      }
    }
    if (((this->Rcc).super_GenVarsT.Enabled & 1U) != 0) {
      bVar3 = InitRccTargets(this);
      if (!bVar3) {
        this_local._7_1_ = 0;
        local_284 = 1;
        goto LAB_0040c64f;
      }
    }
    this_local._7_1_ = 1;
    local_284 = 1;
  }
  else {
    this_local._7_1_ = 0;
    local_284 = 1;
  }
LAB_0040c64f:
  std::__cxx11::string::~string((string *)(cbd.field_2._M_local_buf + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGenInitializer::InitCustomTargets()
{
  // Configurations
  this->MultiConfig = this->GlobalGen->IsMultiConfig();
  this->ConfigDefault = this->Makefile->GetDefaultConfiguration();
  this->ConfigsList =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  // Verbosity
  {
    std::string const def =
      this->Makefile->GetSafeDefinition("CMAKE_AUTOGEN_VERBOSE");
    if (!def.empty()) {
      unsigned long iVerb = 0;
      if (cmStrToULong(def, &iVerb)) {
        // Numeric verbosity
        this->Verbosity = static_cast<unsigned int>(iVerb);
      } else {
        // Non numeric verbosity
        if (cmIsOn(def)) {
          this->Verbosity = 1;
        }
      }
    }
  }

  // Targets FOLDER
  {
    cmValue folder =
      this->Makefile->GetState()->GetGlobalProperty("AUTOMOC_TARGETS_FOLDER");
    if (!folder) {
      folder = this->Makefile->GetState()->GetGlobalProperty(
        "AUTOGEN_TARGETS_FOLDER");
    }
    // Inherit FOLDER property from target (#13688)
    if (!folder) {
      folder = this->GenTarget->GetProperty("FOLDER");
    }
    if (folder) {
      this->TargetsFolder = *folder;
    }
  }

  // Check status of policy CMP0071 regarding handling of GENERATED files
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0071)) {
    case cmPolicies::WARN:
      // Ignore GENERATED files but warn
      this->CMP0071Warn = true;
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // Ignore GENERATED files
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Process GENERATED files
      this->CMP0071Accept = true;
      break;
  }

  // Check status of policy CMP0100 regarding handling of .hh headers
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0100)) {
    case cmPolicies::WARN:
      // Ignore but .hh files but warn
      this->CMP0100Warn = true;
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // Ignore .hh files
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Process .hh file
      this->CMP0100Accept = true;
      break;
  }

  // Common directories
  std::string relativeBuildDir;
  {
    // Collapsed current binary directory
    std::string const cbd = cmSystemTools::CollapseFullPath(
      std::string(), this->Makefile->GetCurrentBinaryDirectory());

    // Info directory
    this->Dir.Info = cmStrCat(cbd, "/CMakeFiles/", this->GenTarget->GetName(),
                              "_autogen.dir");
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Info);

    // Build directory
    this->Dir.Build = this->GenTarget->GetSafeProperty("AUTOGEN_BUILD_DIR");
    if (this->Dir.Build.empty()) {
      this->Dir.Build =
        cmStrCat(cbd, '/', this->GenTarget->GetName(), "_autogen");
    }
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Build);
    this->Dir.RelativeBuild =
      cmSystemTools::RelativePath(cbd, this->Dir.Build);
    // Cleanup build directory
    this->AddCleanFile(this->Dir.Build);

    // Working directory
    this->Dir.Work = cbd;
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Work);

    // Include directory
    this->ConfigFileNamesAndGenex(this->Dir.Include, this->Dir.IncludeGenExp,
                                  cmStrCat(this->Dir.Build, "/include"), "");
  }

  // Moc, Uic and _autogen target settings
  if (this->MocOrUicEnabled()) {
    // Init moc specific settings
    if (this->Moc.Enabled && !this->InitMoc()) {
      return false;
    }

    // Init uic specific settings
    if (this->Uic.Enabled && !this->InitUic()) {
      return false;
    }

    // Autogen target name
    this->AutogenTarget.Name =
      cmStrCat(this->GenTarget->GetName(), "_autogen");

    // Autogen target parallel processing
    {
      using ParallelType = decltype(this->AutogenTarget.Parallel);
      unsigned long propInt = 0;
      std::string const& prop =
        this->GenTarget->GetSafeProperty("AUTOGEN_PARALLEL");
      if (prop.empty() || (prop == "AUTO")) {
        // Autodetect number of CPUs
        this->AutogenTarget.Parallel = GetParallelCPUCount();
      } else if (cmStrToULong(prop, &propInt) && propInt > 0 &&
                 propInt <= std::numeric_limits<ParallelType>::max()) {
        this->AutogenTarget.Parallel = static_cast<ParallelType>(propInt);
      } else {
        // Warn the project author that AUTOGEN_PARALLEL is not valid.
        this->Makefile->IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat("AUTOGEN_PARALLEL=\"", prop, "\" for target \"",
                   this->GenTarget->GetName(),
                   "\" is not valid. Using AUTOGEN_PARALLEL=1"));
        this->AutogenTarget.Parallel = 1;
      }
    }

#ifdef _WIN32
    {
      const auto& value =
        this->GenTarget->GetProperty("AUTOGEN_COMMAND_LINE_LENGTH_MAX");
      if (value.IsSet()) {
        using maxCommandLineLengthType =
          decltype(this->AutogenTarget.MaxCommandLineLength);
        unsigned long propInt = 0;
        if (cmStrToULong(value, &propInt) && propInt > 0 &&
            propInt <= std::numeric_limits<maxCommandLineLengthType>::max()) {
          this->AutogenTarget.MaxCommandLineLength =
            static_cast<maxCommandLineLengthType>(propInt);
        } else {
          // Warn the project author that AUTOGEN_PARALLEL is not valid.
          this->Makefile->IssueMessage(
            MessageType::AUTHOR_WARNING,
            cmStrCat("AUTOGEN_COMMAND_LINE_LENGTH_MAX=\"", *value,
                     "\" for target \"", this->GenTarget->GetName(),
                     "\" is not valid. Using no limit for "
                     "AUTOGEN_COMMAND_LINE_LENGTH_MAX"));
          this->AutogenTarget.MaxCommandLineLength =
            std::numeric_limits<maxCommandLineLengthType>::max();
        }
      } else {
        // Actually 32767 (see
        // https://devblogs.microsoft.com/oldnewthing/20031210-00/?p=41553) but
        // we allow for a small margin
        this->AutogenTarget.MaxCommandLineLength = 32000;
      }
    }
#endif

    // Autogen target info and settings files
    {
      // Info file
      this->AutogenTarget.InfoFile =
        cmStrCat(this->Dir.Info, "/AutogenInfo.json");

      // Used settings file
      this->ConfigFileNames(this->AutogenTarget.SettingsFile,
                            cmStrCat(this->Dir.Info, "/AutogenUsed"), ".txt");
      this->ConfigFileClean(this->AutogenTarget.SettingsFile);

      // Parse cache file
      this->ConfigFileNames(this->AutogenTarget.ParseCacheFile,
                            cmStrCat(this->Dir.Info, "/ParseCache"), ".txt");
      this->ConfigFileClean(this->AutogenTarget.ParseCacheFile);
    }

    // Autogen target: Compute user defined dependencies
    {
      this->AutogenTarget.DependOrigin =
        this->GenTarget->GetPropertyAsBool("AUTOGEN_ORIGIN_DEPENDS");

      std::string const& deps =
        this->GenTarget->GetSafeProperty("AUTOGEN_TARGET_DEPENDS");
      if (!deps.empty()) {
        for (auto const& depName : cmList{ deps }) {
          // Allow target and file dependencies
          auto* depTarget = this->Makefile->FindTargetToUse(depName);
          if (depTarget) {
            this->AutogenTarget.DependTargets.insert(depTarget);
          } else {
            this->AutogenTarget.DependFiles.insert(depName);
          }
        }
      }
    }

    if (this->Moc.Enabled) {
      // Path prefix
      if (this->GenTarget->GetProperty("AUTOMOC_PATH_PREFIX").IsOn()) {
        this->Moc.PathPrefix = true;
      }

      // CMAKE_AUTOMOC_RELAXED_MODE
      if (this->Makefile->IsOn("CMAKE_AUTOMOC_RELAXED_MODE")) {
        this->Moc.RelaxedMode = true;
        this->Makefile->IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat("AUTOMOC: CMAKE_AUTOMOC_RELAXED_MODE is "
                   "deprecated an will be removed in the future.  Consider "
                   "disabling it and converting the target ",
                   this->GenTarget->GetName(), " to regular mode."));
      }

      // Options
      cmExpandList(this->GenTarget->GetSafeProperty("AUTOMOC_MOC_OPTIONS"),
                   this->Moc.Options);
      // Filters
      cmExpandList(this->GenTarget->GetSafeProperty("AUTOMOC_MACRO_NAMES"),
                   this->Moc.MacroNames);
      this->Moc.MacroNames.erase(cmRemoveDuplicates(this->Moc.MacroNames),
                                 this->Moc.MacroNames.end());
      {
        cmList const filterList = { this->GenTarget->GetSafeProperty(
          "AUTOMOC_DEPEND_FILTERS") };
        if ((filterList.size() % 2) != 0) {
          cmSystemTools::Error(
            cmStrCat("AutoMoc: AUTOMOC_DEPEND_FILTERS predefs size ",
                     filterList.size(), " is not a multiple of 2."));
          return false;
        }
        this->Moc.DependFilters.reserve(1 + (filterList.size() / 2));
        this->Moc.DependFilters.emplace_back(
          "Q_PLUGIN_METADATA",
          "[\n][ \t]*Q_PLUGIN_METADATA[ \t]*\\("
          "[^\\)]*FILE[ \t]*\"([^\"]+)\"");
        for (cmList::size_type ii = 0; ii != filterList.size(); ii += 2) {
          this->Moc.DependFilters.emplace_back(filterList[ii],
                                               filterList[ii + 1]);
        }
      }
    }
  }

  // Init rcc specific settings
  if (this->Rcc.Enabled && !this->InitRcc()) {
    return false;
  }

  // Add autogen include directory to the origin target INCLUDE_DIRECTORIES
  if (this->MocOrUicEnabled() || (this->Rcc.Enabled && this->MultiConfig)) {
    auto addBefore = false;
    auto const& value =
      this->GenTarget->GetProperty("AUTOGEN_USE_SYSTEM_INCLUDE");
    if (value.IsSet()) {
      if (value.IsOn()) {
        this->GenTarget->AddSystemIncludeDirectory(this->Dir.IncludeGenExp,
                                                   "CXX");
      } else {
        addBefore = true;
      }
    } else {
      switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0151)) {
        case cmPolicies::WARN:
        case cmPolicies::OLD:
          addBefore = true;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          this->GenTarget->AddSystemIncludeDirectory(this->Dir.IncludeGenExp,
                                                     "CXX");
          break;
      }
    }
    this->GenTarget->AddIncludeDirectory(this->Dir.IncludeGenExp, addBefore);
  }

  // Scan files
  if (!this->InitScanFiles()) {
    return false;
  }

  // Create autogen target
  if (this->MocOrUicEnabled() && !this->InitAutogenTarget()) {
    return false;
  }

  // Create rcc targets
  if (this->Rcc.Enabled && !this->InitRccTargets()) {
    return false;
  }

  return true;
}